

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O1

int __thiscall
soplex::
LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remove(LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,char *__filename)

{
  undefined8 *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  int *piVar5;
  int extraout_EAX;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  pointer pnVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  
  bVar13 = 0;
  uVar12 = (ulong)(this->
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).set.thenum;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::remove(&this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,__filename);
  if (0 < (long)uVar12) {
    lVar7 = 0x1e;
    uVar10 = 0;
    do {
      uVar11 = (ulong)*(uint *)(__filename + uVar10 * 4);
      if (uVar10 != uVar11 && -1 < (int)*(uint *)(__filename + uVar10 * 4)) {
        pnVar3 = (this->low).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar7 * 4);
        puVar8 = puVar1 + -0xf;
        pnVar9 = pnVar3 + uVar11;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)puVar8;
          puVar8 = (undefined8 *)((long)puVar8 + (ulong)bVar13 * -8 + 4);
          pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 4);
        }
        pnVar3[uVar11].m_backend.exp = *(int *)(puVar1 + -1);
        pnVar3[uVar11].m_backend.neg = *(bool *)((long)puVar1 + -4);
        uVar4 = *puVar1;
        pnVar3[uVar11].m_backend.fpclass = (int)uVar4;
        pnVar3[uVar11].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
        pnVar3 = (this->up).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar7 * 4);
        iVar2 = *(int *)(__filename + uVar10 * 4);
        puVar8 = puVar1 + -0xf;
        pnVar9 = pnVar3 + iVar2;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)puVar8;
          puVar8 = (undefined8 *)((long)puVar8 + (ulong)bVar13 * -8 + 4);
          pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 4);
        }
        pnVar3[iVar2].m_backend.exp = *(int *)(puVar1 + -1);
        pnVar3[iVar2].m_backend.neg = *(bool *)((long)puVar1 + -4);
        uVar4 = *puVar1;
        pnVar3[iVar2].m_backend.fpclass = (int)uVar4;
        pnVar3[iVar2].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
        pnVar3 = (this->object).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar7 * 4);
        iVar2 = *(int *)(__filename + uVar10 * 4);
        puVar8 = puVar1 + -0xf;
        pnVar9 = pnVar3 + iVar2;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = *(undefined4 *)puVar8;
          puVar8 = (undefined8 *)((long)puVar8 + (ulong)bVar13 * -8 + 4);
          pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 4);
        }
        pnVar3[iVar2].m_backend.exp = *(int *)(puVar1 + -1);
        pnVar3[iVar2].m_backend.neg = *(bool *)((long)puVar1 + -4);
        uVar4 = *puVar1;
        pnVar3[iVar2].m_backend.fpclass = (int)uVar4;
        pnVar3[iVar2].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
        piVar5 = (this->scaleExp).data;
        piVar5[*(int *)(__filename + uVar10 * 4)] = piVar5[uVar10];
      }
      uVar10 = uVar10 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar12 != uVar10);
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->low,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->up,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->object,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  DataArray<int>::reSize
            (&this->scaleExp,
             (this->
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int perm[])
   {
      int n = num();

      SVSetBase<R>::remove(perm);

      for(int i = 0; i < n; ++i)
      {
         if(perm[i] >= 0 && perm[i] != i)
         {
            low[perm[i]] = low[i];
            up[perm[i]] = up[i];
            object[perm[i]] = object[i];
            scaleExp[perm[i]] = scaleExp[i];
         }
      }

      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }